

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result spvc_compiler_msl_add_discrete_descriptor_set(spvc_compiler compiler,uint desc_set)

{
  spvc_context_s *this;
  spvc_result sVar1;
  allocator local_31;
  string local_30;
  
  if (compiler->backend == SPVC_BACKEND_MSL) {
    spirv_cross::CompilerMSL::add_discrete_descriptor_set
              ((CompilerMSL *)
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,desc_set);
    sVar1 = SPVC_SUCCESS;
  }
  else {
    this = compiler->context;
    std::__cxx11::string::string
              ((string *)&local_30,"MSL function used on a non-MSL backend.",&local_31);
    spvc_context_s::report_error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_msl_add_discrete_descriptor_set(spvc_compiler compiler, unsigned desc_set)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	msl.add_discrete_descriptor_set(desc_set);
	return SPVC_SUCCESS;
#else
	(void)desc_set;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}